

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::bt_peer_connection::on_hash_request(bt_peer_connection *this,int received)

{
  _Atomic_word *p_Var1;
  crypto_receive_buffer *this_00;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *this_01;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *this_03;
  span<const_char> sVar8;
  span<libtorrent::digest32<256L>_> hashes_00;
  hash_request hr;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> hashes;
  sha256_hash file_root;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar5 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
  if ((*(byte *)(CONCAT44(extraout_var,iVar5) + 0x1f) & 1) == 0) {
    file_root.m_number._M_elems._0_16_ = errors::make_error_code(invalid_message);
  }
  else {
    this_00 = &this->m_recv_buffer;
    iVar5 = crypto_receive_buffer::packet_size(this_00);
    if (iVar5 == 0x31) {
      bVar4 = crypto_receive_buffer::packet_finished(this_00);
      if (!bVar4) {
        return;
      }
      this_03 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      this_02 = p_Var3;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar5 = p_Var3->_M_use_count;
          do {
            this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (iVar5 == 0) break;
            LOCK();
            iVar2 = p_Var3->_M_use_count;
            bVar4 = iVar5 == iVar2;
            if (bVar4) {
              p_Var3->_M_use_count = iVar5 + 1;
              iVar2 = iVar5;
            }
            iVar5 = iVar2;
            UNLOCK();
            this_02 = p_Var3;
          } while (!bVar4);
        }
      }
      if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_03 = (torrent *)0x0;
      }
      else if (this_02->_M_use_count == 0) {
        this_03 = (torrent *)0x0;
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var3->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = p_Var3->_M_weak_count;
          p_Var3->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*p_Var3->_vptr__Sp_counted_base[3])();
        }
      }
      this_01 = (this_03->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar8 = crypto_receive_buffer::get(this_00);
      pcVar6 = sVar8.m_ptr;
      file_root.m_number._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar6 + 1);
      file_root.m_number._M_elems._16_8_ = *(undefined8 *)(pcVar6 + 0x11);
      file_root.m_number._M_elems._24_8_ = *(undefined8 *)(pcVar6 + 0x19);
      hr.file = file_storage::file_index_for_root(&this_01->m_files,&file_root);
      lVar7 = 0;
      hr.base = 0;
      do {
        hr.base = (uint)(byte)pcVar6[lVar7 + 0x21] | hr.base << 8;
        lVar7 = lVar7 + 1;
      } while ((int)lVar7 != 4);
      lVar7 = 0;
      hr.index = 0;
      do {
        hr.index = (uint)(byte)pcVar6[lVar7 + 0x25] | hr.index << 8;
        lVar7 = lVar7 + 1;
      } while ((int)lVar7 != 4);
      lVar7 = 0;
      hr.count = 0;
      do {
        hr.count = (uint)(byte)pcVar6[lVar7 + 0x29] | hr.count << 8;
        lVar7 = lVar7 + 1;
      } while ((int)lVar7 != 4);
      lVar7 = 0;
      hr.proof_layers = 0;
      do {
        hr.proof_layers = (uint)(byte)pcVar6[lVar7 + 0x2d] | hr.proof_layers << 8;
        lVar7 = lVar7 + 1;
      } while ((int)lVar7 != 4);
      bVar4 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
      if (bVar4) {
        peer_connection::peer_log
                  (&this->super_peer_connection,incoming_message,"HASH_REQUEST",
                   "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)hr.file.m_val,
                   (ulong)(uint)hr.base,(ulong)(uint)hr.index,(ulong)(uint)hr.count,
                   (ulong)(uint)hr.proof_layers);
      }
      bVar4 = validate_hash_request(&hr,&this_01->m_files);
      if (bVar4) {
        torrent::get_hashes(&hashes,this_03,&hr);
        if (hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          write_hash_reject(this,&hr,&file_root);
        }
        else {
          hashes_00.m_len =
               (long)hashes.
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)hashes.
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
          hashes_00.m_ptr =
               hashes.
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          write_hashes(this,&hr,hashes_00);
        }
        if (hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(hashes.
                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)hashes.
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)hashes.
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        write_hash_reject(this,&hr,&file_root);
      }
      if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      return;
    }
    file_root.m_number._M_elems._0_16_ = errors::make_error_code(invalid_hash_request);
  }
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,&file_root,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_hash_request(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_recv_buffer.packet_size() != 1 + 32 + 4 + 4 + 4 + 4)
		{
			disconnect(errors::invalid_hash_request, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		auto const& files = t->torrent_file().files();

		span<char const> recv_buffer = m_recv_buffer.get();
		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t const file_index = files.file_index_for_root(file_root);
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);
		hash_request hr(file_index, base, index, count, proof_layers);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASH_REQUEST"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		if (!validate_hash_request(hr, files))
		{
			write_hash_reject(hr, file_root);
			return;
		}

		std::vector<sha256_hash> hashes = t->get_hashes(hr);

		if (hashes.empty())
		{
			write_hash_reject(hr, file_root);
			return;
		}

		write_hashes(hr, hashes);
	}